

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  string *this;
  char *local_108;
  string format;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  FilePath output_name;
  FilePath result;
  
  pcVar1 = FLAGS_gtest_output_abi_cxx11_;
  GetOutputFormat_abi_cxx11_();
  if (format._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"xml",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&local_108,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  pcVar1 = strchr(pcVar1,0x3a);
  if (pcVar1 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)(format.field_2._M_local_buf + 8));
    FilePath::FilePath((FilePath *)((long)&output_name.pathname_.field_2 + 8),&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"test_detail",
               (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath((FilePath *)&local_a8,&local_c8);
    FilePath::MakeFileName
              ((FilePath *)local_68,(FilePath *)((long)&output_name.pathname_.field_2 + 8),
               (FilePath *)&local_a8,0,local_108);
    std::__cxx11::string::string((string *)in_RDI,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
    this = &local_88;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(output_name.pathname_.field_2._M_local_buf + 8),pcVar1 + 1,
               (allocator<char> *)&local_88);
    FilePath::FilePath((FilePath *)local_68,(string *)((long)&output_name.pathname_.field_2 + 8));
    std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
    if (*(char *)local_68 != '/') {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath((FilePath *)&local_88,&local_a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(format.field_2._M_local_buf + 8),pcVar1 + 1,
                 (allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xe));
      FilePath::FilePath((FilePath *)&local_c8,(string *)((long)&format.field_2 + 8));
      FilePath::ConcatPaths
                ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)&local_88,
                 (FilePath *)&local_c8);
      std::__cxx11::string::_M_assign((string *)local_68);
      std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((output_name.pathname_._M_dataplus._M_p == (pointer)0x0) ||
       (((char *)((long)local_68 + -1))[(long)output_name.pathname_._M_dataplus._M_p] != '/')) {
      std::__cxx11::string::string((string *)in_RDI,(string *)local_68);
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)local_68,
                 (FilePath *)&local_88,local_a8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string
                ((string *)in_RDI,(string *)(output_name.pathname_.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(output_name.pathname_.field_2._M_local_buf + 8));
    }
    this = (string *)local_68;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_108);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}